

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_ctx.cc
# Opt level: O1

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Pattern::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Pattern *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  uint32_t uVar1;
  MthdPatternBitmapColor *pMVar2;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar3;
  SingleMthdTest *this_01;
  result_type rVar4;
  Test *pTVar5;
  MthdPatternBitmap *pMVar6;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_261;
  MthdPatternBitmapColor *local_260;
  MthdPatternBitmapColor *local_258;
  Test *local_250;
  Test *local_248;
  Test *local_240;
  Test *local_238;
  Test *local_230;
  Test *local_228;
  SingleMthdTest *local_220;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_218;
  undefined1 *local_210;
  long local_208;
  undefined1 local_200 [16];
  undefined1 *local_1f0;
  long local_1e8;
  undefined1 local_1e0 [16];
  undefined1 *local_1d0;
  long local_1c8;
  undefined1 local_1c0 [16];
  undefined1 *local_1b0;
  long local_1a8;
  undefined1 local_1a0 [16];
  undefined1 *local_190;
  long local_188;
  undefined1 local_180 [16];
  undefined1 *local_170;
  long local_168;
  undefined1 local_160 [16];
  undefined1 *local_150;
  long local_148;
  undefined1 local_140 [16];
  undefined1 *local_130;
  long local_128;
  undefined1 local_120 [16];
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  SingleMthdTest *local_90;
  Test *local_88;
  Test *local_80;
  Test *local_78;
  Test *local_70;
  Test *local_68;
  Test *local_60;
  Test *local_58;
  MthdPatternBitmapColor *local_50;
  MthdPatternBitmapColor *local_48;
  MthdPatternBitmap *local_40;
  MthdPatternBitmap *local_38;
  
  local_218 = __return_storage_ptr__;
  this_01 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  local_220 = this_01;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_130 = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"nop","");
  opt = &(this->super_Class).opt;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)this_01,opt,(uint32_t)rVar4);
  (this_01->super_MthdTest).trapbit = -1;
  (this_01->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00348698;
  this_01->s_cls = uVar1;
  this_01->s_mthd = 0x100;
  this_01->s_stride = 4;
  this_01->s_num = 1;
  this_01->s_trapbit = -1;
  (this_01->name)._M_dataplus._M_p = (pointer)&(this_01->name).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this_01->name,local_130,local_130 + local_128);
  (this_01->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_003489c8;
  local_90 = this_01;
  local_228 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_150 = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"notify","");
  pTVar5 = local_228;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_228,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x104;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_150,local_150 + local_148);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348bb8;
  local_88 = pTVar5;
  local_230 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_170 = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"pm_trigger","");
  pTVar5 = local_230;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_230,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x140;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_170,local_170 + local_168);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034a9f8;
  local_80 = pTVar5;
  local_238 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_190 = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"dma_notify","");
  pTVar5 = local_238;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_238,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x180;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 1;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_190,local_190 + local_188);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349850;
  local_78 = pTVar5;
  local_240 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"missing","");
  pTVar5 = local_240;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_240,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x200;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_1b0,local_1b0 + local_1a8);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034a6b8;
  local_70 = pTVar5;
  local_248 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"format","");
  pTVar5 = local_248;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_248,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x300;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 2;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_1d0,local_1d0 + local_1c8);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034add8;
  local_68 = pTVar5;
  local_250 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"bitmap_format","");
  pTVar5 = local_250;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_250,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x304;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 3;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_1f0,local_1f0 + local_1e8);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034a7b0;
  local_60 = pTVar5;
  pTVar5 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_210 = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"pattern_shape","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x308;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 4;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_210,local_210 + local_208);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034b0c0;
  local_58 = pTVar5;
  local_258 = (MthdPatternBitmapColor *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"pattern_bitmap_color_0","");
  pMVar2 = local_258;
  MthdPatternBitmapColor::MthdPatternBitmapColor
            (local_258,opt,(uint32_t)rVar4,&local_d0,5,(this->super_Class).cls,0x310,0);
  local_50 = pMVar2;
  local_260 = (MthdPatternBitmapColor *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"pattern_bitmap_color_1","");
  pMVar2 = local_260;
  MthdPatternBitmapColor::MthdPatternBitmapColor
            (local_260,opt,(uint32_t)rVar4,&local_f0,6,(this->super_Class).cls,0x314,1);
  local_48 = pMVar2;
  pMVar6 = (MthdPatternBitmap *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"pattern_bitmap_0","");
  MthdPatternBitmap::MthdPatternBitmap
            (pMVar6,opt,(uint32_t)rVar4,&local_110,7,(this->super_Class).cls,0x318,0);
  local_40 = pMVar6;
  pMVar6 = (MthdPatternBitmap *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"pattern_bitmap_1","");
  MthdPatternBitmap::MthdPatternBitmap
            (pMVar6,opt,(uint32_t)rVar4,&local_b0,8,(this->super_Class).cls,0x31c,1);
  pvVar3 = local_218;
  __l._M_len = 0xc;
  __l._M_array = &local_90;
  local_38 = pMVar6;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_218,__l,&local_261);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_210 != local_200) {
    operator_delete(local_210);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  if (local_190 != local_180) {
    operator_delete(local_190);
  }
  if (local_170 != local_160) {
    operator_delete(local_170);
  }
  if (local_150 != local_140) {
    operator_delete(local_150);
  }
  if (local_130 != local_120) {
    operator_delete(local_130);
  }
  return pvVar3;
}

Assistant:

std::vector<SingleMthdTest *> Pattern::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200),
		new MthdCtxFormat(opt, rnd(), "format", 2, cls, 0x300),
		new MthdBitmapFormat(opt, rnd(), "bitmap_format", 3, cls, 0x304),
		new MthdPatternShape(opt, rnd(), "pattern_shape", 4, cls, 0x308),
		new MthdPatternBitmapColor(opt, rnd(), "pattern_bitmap_color_0", 5, cls, 0x310, 0),
		new MthdPatternBitmapColor(opt, rnd(), "pattern_bitmap_color_1", 6, cls, 0x314, 1),
		new MthdPatternBitmap(opt, rnd(), "pattern_bitmap_0", 7, cls, 0x318, 0),
		new MthdPatternBitmap(opt, rnd(), "pattern_bitmap_1", 8, cls, 0x31c, 1),
	};
}